

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

size_t __thiscall
edition_unittest::TestMutualRecursionA_SubGroup::ByteSizeLong(TestMutualRecursionA_SubGroup *this)

{
  anon_union_24_1_493b367e_for_TestMutualRecursionA_SubGroup_3 aVar1;
  size_t sVar2;
  size_t sVar3;
  
  aVar1 = this->field_0;
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x3) == (undefined1  [24])0x0) {
    sVar3 = 0;
  }
  else {
    if (((undefined1  [24])aVar1 & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestMutualRecursionA_SubMessage>
                        ((this->field_0)._impl_.sub_message_);
      sVar3 = sVar3 + 1;
    }
    if (((undefined1  [24])aVar1 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestAllTypes>((this->field_0)._impl_.not_in_this_scc_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestMutualRecursionA_SubGroup::ByteSizeLong() const {
  const TestMutualRecursionA_SubGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestMutualRecursionA.SubGroup)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .edition_unittest.TestMutualRecursionA.SubMessage sub_message = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.sub_message_);
    }
    // .edition_unittest.TestAllTypes not_in_this_scc = 4;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.not_in_this_scc_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}